

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

int Gia_ManBmcFindFirst(Gia_Man_t *pFrames)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int v;
  
  v = 0;
  while (((iVar2 = -1, v < pFrames->vCos->nSize - pFrames->nRegs &&
          (pGVar1 = Gia_ManCo(pFrames,v), pGVar1 != (Gia_Obj_t *)0x0)) &&
         (iVar2 = v,
         pFrames->pObjs ==
         (Gia_Obj_t *)
         ((ulong)((uint)*(undefined8 *)pGVar1 >> 0x1d & 1) ^
         (ulong)(pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)))))) {
    v = v + 1;
  }
  return iVar2;
}

Assistant:

int Gia_ManBmcFindFirst( Gia_Man_t * pFrames )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachPo( pFrames, pObj, i )
        if ( Gia_ObjChild0(pObj) != Gia_ManConst0(pFrames) )
            return i;
    return -1;
}